

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_target_write_size_bytes
                    (ma_dr_wav_data_format *pFormat,ma_uint64 totalFrameCount,
                    ma_dr_wav_metadata *pMetadata,ma_uint32 metadataCount)

{
  ma_dr_wav_container mVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  
  dVar6 = (double)(long)((ulong)pFormat->bitsPerSample * pFormat->channels * totalFrameCount) *
          0.125;
  mVar1 = pFormat->container;
  uVar5 = (ulong)dVar6;
  uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
  uVar4 = (uint)uVar5;
  if (mVar1 == ma_dr_wav_container_rf64) {
    sVar2 = ma_dr_wav__write_or_count_metadata((ma_dr_wav *)0x0,pMetadata,metadataCount);
    uVar5 = (uVar4 & 1) + uVar5 + sVar2 + 0x48;
  }
  else {
    if (mVar1 == ma_dr_wav_container_w64) {
      return (uVar4 & 7) + uVar5 + 0x68;
    }
    if (mVar1 != ma_dr_wav_container_riff) {
      return 0;
    }
    sVar2 = ma_dr_wav__write_or_count_metadata((ma_dr_wav *)0x0,pMetadata,metadataCount);
    uVar5 = (uVar4 & 1) + uVar5 + sVar2 + 0x24;
  }
  uVar3 = 0xffffffff;
  if (uVar5 < 0xffffffff) {
    uVar3 = uVar5;
  }
  return uVar3 + 8;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_target_write_size_bytes(const ma_dr_wav_data_format* pFormat, ma_uint64 totalFrameCount, ma_dr_wav_metadata* pMetadata, ma_uint32 metadataCount)
{
    ma_uint64 targetDataSizeBytes = (ma_uint64)((ma_int64)totalFrameCount * pFormat->channels * pFormat->bitsPerSample/8.0);
    ma_uint64 riffChunkSizeBytes;
    ma_uint64 fileSizeBytes = 0;
    if (pFormat->container == ma_dr_wav_container_riff) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_riff(targetDataSizeBytes, pMetadata, metadataCount);
        fileSizeBytes = (8 + riffChunkSizeBytes);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_w64(targetDataSizeBytes);
        fileSizeBytes = riffChunkSizeBytes;
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        riffChunkSizeBytes = ma_dr_wav__riff_chunk_size_rf64(targetDataSizeBytes, pMetadata, metadataCount);
        fileSizeBytes = (8 + riffChunkSizeBytes);
    }
    return fileSizeBytes;
}